

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
 __thiscall
absl::lts_20250127::container_internal::
btree<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
::
internal_last<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>,std::pair<long,long>const&,std::pair<long,long>const*>>
          (btree<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
           *this,btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                 iter)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
  bVar4;
  undefined1 auStack_28 [8];
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
  iter_local;
  
  iter_local.node_._0_4_ = (uint)iter.node_;
  auStack_28 = (undefined1  [8])this;
  if (this == (btree<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
               *)0x0) {
    __assert_fail("iter.node_ != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                  ,0xaec,
                  "static IterType absl::container_internal::btree<absl::container_internal::set_params<std::pair<long, long>, std::less<std::pair<long, long>>, std::allocator<std::pair<long, long>>, 256, false>>::internal_last(IterType) [Params = absl::container_internal::set_params<std::pair<long, long>, std::less<std::pair<long, long>>, std::allocator<std::pair<long, long>>, 256, false>, IterType = absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<long, long>, std::less<std::pair<long, long>>, std::allocator<std::pair<long, long>>, 256, false>>, const std::pair<long, long> &, const std::pair<long, long> *>]"
                 );
  }
  do {
    uVar1 = (uint)iter_local.node_;
    bVar2 = btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
            ::finish((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
                      *)auStack_28);
    if (uVar1 != bVar2) goto LAB_003a04cb;
    bVar2 = btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
            ::position((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
                        *)auStack_28);
    iter_local.node_._0_4_ = (uint)bVar2;
    auStack_28 = (undefined1  [8])
                 btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
                 ::parent((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
                           *)auStack_28);
    bVar3 = btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
            ::is_leaf((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
                       *)auStack_28);
  } while (!bVar3);
  auStack_28 = (undefined1  [8])0x0;
LAB_003a04cb:
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
  ::update_generation((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                       *)auStack_28);
  bVar4.position_ = (uint)iter_local.node_;
  bVar4.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
                 *)auStack_28;
  bVar4._12_4_ = 0;
  return bVar4;
}

Assistant:

inline IterType btree<P>::internal_last(IterType iter) {
  assert(iter.node_ != nullptr);
  while (iter.position_ == iter.node_->finish()) {
    iter.position_ = iter.node_->position();
    iter.node_ = iter.node_->parent();
    if (iter.node_->is_leaf()) {
      iter.node_ = nullptr;
      break;
    }
  }
  iter.update_generation();
  return iter;
}